

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-writer.c
# Opt level: O2

void test_bson_writer_custom_realloc(void)

{
  char cVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStack_30;
  int x;
  bson_t *b;
  uint8_t *buf;
  size_t buflen;
  
  buf = (uint8_t *)bson_malloc(0);
  buflen = 0;
  uVar2 = bson_writer_new(&buf,&buflen,0,test_bson_writer_custom_realloc_helper);
  cVar1 = bson_writer_begin(uVar2,&b);
  if (cVar1 == '\0') {
    pcVar3 = "bson_writer_begin (writer, &b)";
    uStack_30 = 0x2d;
  }
  else {
    cVar1 = bson_append_utf8(b,"hello",0xffffffffffffffff,"world",0xffffffff);
    if (cVar1 != '\0') {
      bson_writer_end(uVar2);
      bson_writer_destroy(uVar2);
      fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)x > 0\n",0x35);
      abort();
    }
    pcVar3 = "bson_append_utf8 (b, \"hello\", -1, \"world\", -1)";
    uStack_30 = 0x2f;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-writer.c",
          uStack_30,"test_bson_writer_custom_realloc",pcVar3);
  abort();
}

Assistant:

static void
test_bson_writer_custom_realloc (void)
{
   bson_writer_t *writer;
   uint8_t *buf = bson_malloc (0);
   size_t buflen = 0;
   bson_t *b;
   int x = 0;

   writer = bson_writer_new (
      &buf, &buflen, 0, test_bson_writer_custom_realloc_helper, &x);

   BSON_ASSERT (bson_writer_begin (writer, &b));

   BSON_ASSERT (bson_append_utf8 (b, "hello", -1, "world", -1));

   bson_writer_end (writer);

   bson_writer_destroy (writer);

   BSON_ASSERT_CMPINT (x, >, 0);

   bson_free (buf);
}